

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::MeshVisitor
               (Path *abs_path,Prim *prim,int32_t level,void *userdata,string *err)

{
  MaterialBinding *this;
  Stage *pSVar1;
  Prim *abs_path_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  GeomMesh *mesh;
  mapped_type *this_00;
  long lVar5;
  size_type sVar6;
  bool local_f69;
  bool local_f41;
  string local_f30;
  size_type local_f10;
  uint64_t mesh_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ee8;
  string local_ec8;
  allocator local_ea1;
  string local_ea0 [32];
  fmt local_e80 [32];
  undefined1 local_e60 [8];
  RenderMesh rmesh;
  string local_938 [32];
  fmt local_918 [32];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  local_8f8;
  undefined1 local_8e0 [8];
  string local_err;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
  blendshapes;
  string local_888;
  string local_868 [32];
  int64_t local_848;
  int64_t rmaterial_id_3;
  Material *pMStack_838;
  bool ret_3;
  Material *bound_material_3;
  Path bound_material_path_3;
  Token local_758;
  undefined1 local_738 [8];
  string backface_purpose_1;
  string local_6f8;
  string local_6d8 [32];
  int64_t local_6b8;
  int64_t rmaterial_id_2;
  string local_6a8;
  undefined1 local_681;
  Material *pMStack_680;
  bool ret_2;
  Material *bound_material_2;
  Path bound_material_path_2;
  string mesh_path_str;
  MaterialPath material_path;
  string local_500;
  string local_4e0 [32];
  int64_t local_4c0;
  int64_t rmaterial_id_1;
  Material *pMStack_4b0;
  bool ret_1;
  Material *bound_material_1;
  Path bound_material_path_1;
  Token local_3d0;
  undefined1 local_3b0 [8];
  string backface_purpose;
  string local_368;
  string local_348 [32];
  int64_t local_328;
  int64_t rmaterial_id;
  string local_318;
  undefined1 local_2f1;
  Material *pMStack_2f0;
  bool ret;
  Material *bound_material;
  Path bound_material_path;
  Path subset_abs_path;
  MaterialPath mpath;
  GeomSubset **psubset;
  iterator __end4;
  iterator __begin4;
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *__range4;
  undefined1 local_a8 [8];
  vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
  material_subsets;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
  subset_material_path_map;
  anon_class_16_2_91e644f1 ConvertBoundMaterial;
  GeomMesh *pmesh;
  MeshVisitorEnv *visitorEnv;
  string *err_local;
  void *userdata_local;
  Prim *pPStack_28;
  int32_t level_local;
  Prim *prim_local;
  Path *abs_path_local;
  
  visitorEnv = (MeshVisitorEnv *)err;
  err_local = (string *)userdata;
  userdata_local._4_4_ = level;
  pPStack_28 = prim;
  prim_local = (Prim *)abs_path;
  if (userdata == (void *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"userdata pointer must be filled.");
    }
    abs_path_local._7_1_ = 0;
    goto LAB_004cb3db;
  }
  pmesh = (GeomMesh *)userdata;
  if (0x100000 < level) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Scene graph is too deep.\n");
    }
    abs_path_local._7_1_ = 0;
    goto LAB_004cb3db;
  }
  mesh = Prim::as<tinyusdz::GeomMesh>(prim);
  if (mesh != (GeomMesh *)0x0) {
    bVar2 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>_>
            ::authored(&mesh->points);
    if (!bVar2) {
      abs_path_local._7_1_ = 1;
      goto LAB_004cb3db;
    }
    subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&pmesh;
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
           *)&material_subsets.
              super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
    vector((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *)
           local_a8);
    GetMaterialBindGeomSubsets
              ((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                *)&__range4,pPStack_28);
    ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
    operator=((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
              )local_a8,
              (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *
              )&__range4);
    ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
    ~vector((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *)
            &__range4);
    __end4 = ::std::
             vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
             begin((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                    *)local_a8);
    psubset = (GeomSubset **)
              ::std::
              vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
              end((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                   *)local_a8);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_tinyusdz::GeomSubset_**,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
                                       *)&psubset), bVar2) {
      mpath.default_texcoords_primvar_name.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_tinyusdz::GeomSubset_**,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
           ::operator*(&__end4);
      MaterialPath::MaterialPath((MaterialPath *)&subset_abs_path._valid);
      ::std::__cxx11::string::operator=
                ((string *)&mpath.default_material_id,
                 (string *)
                 &(((pmesh->super_GPrim).super_Xformable.xformOps.
                    super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                    _M_impl.super__Vector_impl_data._M_finish)->suffix)._M_string_length);
      Path::AppendElement((Path *)&bound_material_path._valid,&prim_local->_abs_path,
                          (string *)
                          (*(long *)mpath.default_texcoords_primvar_name.field_2._8_8_ + 0x9d8));
      Path::Path((Path *)&bound_material);
      pMStack_2f0 = (Material *)0x0;
      pSVar1 = (Stage *)(pmesh->super_GPrim).super_Xformable.xformOps.
                        super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                        _M_impl.super__Vector_impl_data._M_finish[3]._var._value.v_.storage.dynamic;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_318,"",(allocator *)((long)&rmaterial_id + 7))
      ;
      bVar2 = GetBoundMaterial(pSVar1,(Path *)&bound_material_path._valid,&local_318,
                               (Path *)&bound_material,&stack0xfffffffffffffd10,(string *)visitorEnv
                              );
      ::std::__cxx11::string::~string((string *)&local_318);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&rmaterial_id + 7));
      local_2f1 = bVar2;
      if ((bVar2) && (pMStack_2f0 != (Material *)0x0)) {
        local_328 = -1;
        bVar2 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                          ((anon_class_16_2_91e644f1 *)
                           &subset_material_path_map._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count,(Path *)&bound_material,pMStack_2f0,&local_328);
        if (bVar2) {
          Path::full_path_name_abi_cxx11_
                    ((string *)((long)&backface_purpose.field_2 + 8),(Path *)&bound_material);
          ::std::__cxx11::string::operator=
                    ((string *)&subset_abs_path._valid,
                     (string *)(backface_purpose.field_2._M_local_buf + 8));
          ::std::__cxx11::string::~string((string *)(backface_purpose.field_2._M_local_buf + 8));
          goto LAB_004ca934;
        }
        if (visitorEnv != (MeshVisitorEnv *)0x0) {
          Path::full_path_name_abi_cxx11_(&local_368,(Path *)&bound_material);
          ::std::operator+((char *)local_348,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Convert boundMaterial failed: ");
          ::std::__cxx11::string::operator+=((string *)visitorEnv,local_348);
          ::std::__cxx11::string::~string(local_348);
          ::std::__cxx11::string::~string((string *)&local_368);
        }
        abs_path_local._7_1_ = 0;
        bVar2 = true;
      }
      else {
LAB_004ca934:
        bVar2 = false;
      }
      Path::~Path((Path *)&bound_material);
      if (!bVar2) {
        ::std::__cxx11::string::string
                  ((string *)local_3b0,
                   (string *)
                   ((long)&(pmesh->super_GPrim).super_Xformable.xformOps.
                           super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                           ._M_impl.super__Vector_impl_data._M_finish[1]._var._value.v_.storage + 8)
                  );
        uVar3 = ::std::__cxx11::string::empty();
        bound_material_path_1._207_1_ = 0;
        local_f41 = false;
        if ((uVar3 & 1) == 0) {
          this = *(MaterialBinding **)mpath.default_texcoords_primvar_name.field_2._8_8_;
          Token::Token(&local_3d0,(string *)local_3b0);
          bound_material_path_1._207_1_ = 1;
          local_f41 = MaterialBinding::has_materialBinding(this,&local_3d0);
        }
        if ((bound_material_path_1._207_1_ & 1) != 0) {
          Token::~Token(&local_3d0);
        }
        if (local_f41 == false) {
LAB_004cab76:
          this_00 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
                                  *)&material_subsets.
                                     super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (key_type *)
                                 (*(long *)mpath.default_texcoords_primvar_name.field_2._8_8_ +
                                 0x9d8));
          MaterialPath::operator=(this_00,(MaterialPath *)&subset_abs_path._valid);
          bVar2 = false;
        }
        else {
          Path::Path((Path *)&bound_material_1);
          pMStack_4b0 = (Material *)0x0;
          rmaterial_id_1._7_1_ =
               GetBoundMaterial((Stage *)(pmesh->super_GPrim).super_Xformable.xformOps.
                                         super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[3]._var._value.
                                         v_.storage.dynamic,(Path *)&bound_material_path._valid,
                                (string *)
                                ((long)&(pmesh->super_GPrim).super_Xformable.xformOps.
                                        super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                        ._M_impl.super__Vector_impl_data._M_finish[1]._var._value.v_
                                        .storage + 8),(Path *)&bound_material_1,
                                &stack0xfffffffffffffb50,(string *)visitorEnv);
          if (((bool)rmaterial_id_1._7_1_) && (pMStack_4b0 != (Material *)0x0)) {
            local_4c0 = -1;
            bVar2 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                              ((anon_class_16_2_91e644f1 *)
                               &subset_material_path_map._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count,(Path *)&bound_material_1,pMStack_4b0,&local_4c0);
            if (bVar2) {
              Path::full_path_name_abi_cxx11_
                        ((string *)((long)&material_path.default_texcoords_primvar_name.field_2 + 8)
                         ,(Path *)&bound_material_1);
              ::std::__cxx11::string::operator=
                        ((string *)(mpath.material_path.field_2._M_local_buf + 8),
                         (string *)
                         (material_path.default_texcoords_primvar_name.field_2._M_local_buf + 8));
              ::std::__cxx11::string::~string
                        ((string *)
                         (material_path.default_texcoords_primvar_name.field_2._M_local_buf + 8));
              goto LAB_004cab52;
            }
            if (visitorEnv != (MeshVisitorEnv *)0x0) {
              Path::full_path_name_abi_cxx11_(&local_500,(Path *)&bound_material_1);
              ::std::operator+((char *)local_4e0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "Convert boundMaterial failed: ");
              ::std::__cxx11::string::operator+=((string *)visitorEnv,local_4e0);
              ::std::__cxx11::string::~string(local_4e0);
              ::std::__cxx11::string::~string((string *)&local_500);
            }
            abs_path_local._7_1_ = 0;
            bVar2 = true;
          }
          else {
LAB_004cab52:
            bVar2 = false;
          }
          Path::~Path((Path *)&bound_material_1);
          if (!bVar2) goto LAB_004cab76;
        }
        ::std::__cxx11::string::~string((string *)local_3b0);
      }
      Path::~Path((Path *)&bound_material_path._valid);
      MaterialPath::~MaterialPath((MaterialPath *)&subset_abs_path._valid);
      if (bVar2) goto LAB_004cb3af;
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::GeomSubset_**,_std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>_>
      ::operator++(&__end4);
    }
    MaterialPath::MaterialPath((MaterialPath *)((long)&mesh_path_str.field_2 + 8));
    ::std::__cxx11::string::operator=
              ((string *)&material_path.default_material_id,
               (string *)
               &(((pmesh->super_GPrim).super_Xformable.xformOps.
                  super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
                  super__Vector_impl_data._M_finish)->suffix)._M_string_length);
    Path::full_path_name_abi_cxx11_((string *)&bound_material_path_2._valid,&prim_local->_abs_path);
    Path::Path((Path *)&bound_material_2);
    abs_path_00 = prim_local;
    pMStack_680 = (Material *)0x0;
    pSVar1 = (Stage *)(pmesh->super_GPrim).super_Xformable.xformOps.
                      super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                      _M_impl.super__Vector_impl_data._M_finish[3]._var._value.v_.storage.dynamic;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6a8,"",(allocator *)((long)&rmaterial_id_2 + 7))
    ;
    bVar2 = GetBoundMaterial(pSVar1,&abs_path_00->_abs_path,&local_6a8,(Path *)&bound_material_2,
                             &stack0xfffffffffffff980,(string *)visitorEnv);
    ::std::__cxx11::string::~string((string *)&local_6a8);
    ::std::allocator<char>::~allocator((allocator<char> *)((long)&rmaterial_id_2 + 7));
    local_681 = bVar2;
    if ((bVar2) && (pMStack_680 != (Material *)0x0)) {
      local_6b8 = -1;
      bVar2 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                        ((anon_class_16_2_91e644f1 *)
                         &subset_material_path_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (Path *)&bound_material_2,pMStack_680,&local_6b8);
      if (bVar2) {
        Path::full_path_name_abi_cxx11_
                  ((string *)((long)&backface_purpose_1.field_2 + 8),(Path *)&bound_material_2);
        ::std::__cxx11::string::operator=
                  ((string *)(mesh_path_str.field_2._M_local_buf + 8),
                   (string *)(backface_purpose_1.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)(backface_purpose_1.field_2._M_local_buf + 8));
        goto LAB_004cadcb;
      }
      if (visitorEnv != (MeshVisitorEnv *)0x0) {
        Path::full_path_name_abi_cxx11_(&local_6f8,(Path *)&bound_material_2);
        ::std::operator+((char *)local_6d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Convert boundMaterial failed: ");
        ::std::__cxx11::string::operator+=((string *)visitorEnv,local_6d8);
        ::std::__cxx11::string::~string(local_6d8);
        ::std::__cxx11::string::~string((string *)&local_6f8);
      }
      abs_path_local._7_1_ = 0;
      bVar2 = true;
    }
    else {
LAB_004cadcb:
      bVar2 = false;
    }
    Path::~Path((Path *)&bound_material_2);
    if (!bVar2) {
      ::std::__cxx11::string::string
                ((string *)local_738,
                 (string *)
                 ((long)&(pmesh->super_GPrim).super_Xformable.xformOps.
                         super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                         _M_impl.super__Vector_impl_data._M_finish[1]._var._value.v_.storage + 8));
      uVar3 = ::std::__cxx11::string::empty();
      bound_material_path_3._207_1_ = 0;
      local_f69 = false;
      if ((uVar3 & 1) == 0) {
        Token::Token(&local_758,(string *)local_738);
        bound_material_path_3._207_1_ = 1;
        local_f69 = MaterialBinding::has_materialBinding
                              (&(mesh->super_GPrim).super_MaterialBinding,&local_758);
      }
      if ((bound_material_path_3._207_1_ & 1) != 0) {
        Token::~Token(&local_758);
      }
      if (local_f69 == false) {
LAB_004cb00e:
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                  *)((long)&local_err.field_2 + 8));
        ::std::__cxx11::string::string((string *)local_8e0);
        GetBlendShapes(&local_8f8,
                       (Stage *)(pmesh->super_GPrim).super_Xformable.xformOps.
                                super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                ._M_impl.super__Vector_impl_data._M_finish[3]._var._value.v_.storage
                                .dynamic,pPStack_28,(string *)local_8e0);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::operator=((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                     *)((long)&local_err.field_2 + 8),&local_8f8);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector(&local_8f8);
        lVar5 = ::std::__cxx11::string::size();
        if ((lVar5 != 0) && (visitorEnv != (MeshVisitorEnv *)0x0)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_938,"Failed to get BlendShapes prims. err = {}",
                     (allocator *)((long)&rmesh.handle + 7));
          fmt::format<std::__cxx11::string>
                    (local_918,(string *)local_938,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0)
          ;
          ::std::__cxx11::string::operator+=((string *)visitorEnv,(string *)local_918);
          ::std::__cxx11::string::~string((string *)local_918);
          ::std::__cxx11::string::~string(local_938);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&rmesh.handle + 7));
        }
        ::std::__cxx11::string::~string((string *)local_8e0);
        RenderMesh::RenderMesh((RenderMesh *)local_e60);
        bVar2 = RenderSceneConverter::ConvertMesh
                          ((RenderSceneConverter *)
                           (pmesh->super_GPrim).super_Xformable.xformOps.
                           super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (RenderSceneConverterEnv *)
                           (pmesh->super_GPrim).super_Xformable.xformOps.
                           super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&prim_local->_abs_path,mesh,
                           (MaterialPath *)((long)&mesh_path_str.field_2 + 8),
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
                            *)&material_subsets.
                               super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (StringAndIdMap *)
                           ((long)(pmesh->super_GPrim).super_Xformable.xformOps.
                                  super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 0xc0),
                           (vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
                            *)local_a8,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                            *)((long)&local_err.field_2 + 8),(RenderMesh *)local_e60);
        if (bVar2) {
          sVar6 = ::std::
                  vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                  ::size((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                          *)((long)(pmesh->super_GPrim).super_Xformable.xformOps.
                                   super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 0x380));
          local_f10 = sVar6;
          iVar4 = ::std::numeric_limits<int>::max();
          if (sVar6 < (ulong)(long)iVar4) {
            lVar5 = (long)(pmesh->super_GPrim).super_Xformable.xformOps.
                          super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                          _M_impl.super__Vector_impl_data._M_start;
            Path::full_path_name_abi_cxx11_(&local_f30,&prim_local->_abs_path);
            StringAndIdMap::add((StringAndIdMap *)(lVar5 + 0x60),&local_f30,local_f10);
            ::std::__cxx11::string::~string((string *)&local_f30);
            ::std::vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
            ::emplace_back<tinyusdz::tydra::RenderMesh>
                      ((vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                        *)((long)(pmesh->super_GPrim).super_Xformable.xformOps.
                                 super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 0x380),
                       (RenderMesh *)local_e60);
            bVar2 = false;
          }
          else {
            if (visitorEnv != (MeshVisitorEnv *)0x0) {
              ::std::__cxx11::string::operator+=((string *)visitorEnv,"Mesh index too large.\n");
            }
            abs_path_local._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          if (visitorEnv != (MeshVisitorEnv *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_ea0,"Mesh conversion failed: {}",&local_ea1);
            Path::full_path_name_abi_cxx11_(&local_ec8,&prim_local->_abs_path);
            fmt::format<std::__cxx11::string>
                      (local_e80,(string *)local_ea0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_ec8);
            ::std::__cxx11::string::operator+=((string *)visitorEnv,(string *)local_e80);
            ::std::__cxx11::string::~string((string *)local_e80);
            ::std::__cxx11::string::~string((string *)&local_ec8);
            ::std::__cxx11::string::~string(local_ea0);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
            RenderSceneConverter::GetError_abi_cxx11_
                      ((RenderSceneConverter *)
                       (pmesh->super_GPrim).super_Xformable.xformOps.
                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            ::std::operator+((char *)&mesh_id,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x9d0055);
            ::std::operator+(&local_ee8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mesh_id,"\n");
            ::std::__cxx11::string::operator+=((string *)visitorEnv,(string *)&local_ee8);
            ::std::__cxx11::string::~string((string *)&local_ee8);
            ::std::__cxx11::string::~string((string *)&mesh_id);
          }
          abs_path_local._7_1_ = 0;
          bVar2 = true;
        }
        RenderMesh::~RenderMesh((RenderMesh *)local_e60);
        ::std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                   *)((long)&local_err.field_2 + 8));
      }
      else {
        Path::Path((Path *)&bound_material_3);
        pMStack_838 = (Material *)0x0;
        rmaterial_id_3._7_1_ =
             GetBoundMaterial((Stage *)(pmesh->super_GPrim).super_Xformable.xformOps.
                                       super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                       ._M_impl.super__Vector_impl_data._M_finish[3]._var._value.v_.
                                       storage.dynamic,&prim_local->_abs_path,
                              (string *)
                              ((long)&(pmesh->super_GPrim).super_Xformable.xformOps.
                                      super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>
                                      ._M_impl.super__Vector_impl_data._M_finish[1]._var._value.v_.
                                      storage + 8),(Path *)&bound_material_3,
                              &stack0xfffffffffffff7c8,(string *)visitorEnv);
        if (((bool)rmaterial_id_3._7_1_) && (pMStack_838 != (Material *)0x0)) {
          local_848 = -1;
          bVar2 = MeshVisitor::anon_class_16_2_91e644f1::operator()
                            ((anon_class_16_2_91e644f1 *)
                             &subset_material_path_map._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count,(Path *)&bound_material_3,pMStack_838,&local_848);
          if (bVar2) {
            Path::full_path_name_abi_cxx11_
                      ((string *)
                       &blendshapes.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(Path *)&bound_material_3
                      );
            ::std::__cxx11::string::operator=
                      ((string *)(material_path.material_path.field_2._M_local_buf + 8),
                       (string *)
                       &blendshapes.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string
                      ((string *)
                       &blendshapes.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::BlendShape_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            goto LAB_004cafe6;
          }
          if (visitorEnv != (MeshVisitorEnv *)0x0) {
            Path::full_path_name_abi_cxx11_(&local_888,(Path *)&bound_material_3);
            ::std::operator+((char *)local_868,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "Convert boundMaterial failed: ");
            ::std::__cxx11::string::operator+=((string *)visitorEnv,local_868);
            ::std::__cxx11::string::~string(local_868);
            ::std::__cxx11::string::~string((string *)&local_888);
          }
          abs_path_local._7_1_ = 0;
          bVar2 = true;
        }
        else {
LAB_004cafe6:
          bVar2 = false;
        }
        Path::~Path((Path *)&bound_material_3);
        if (!bVar2) goto LAB_004cb00e;
      }
      ::std::__cxx11::string::~string((string *)local_738);
    }
    ::std::__cxx11::string::~string((string *)&bound_material_path_2._valid);
    if (!bVar2) {
      bVar2 = false;
    }
    MaterialPath::~MaterialPath((MaterialPath *)((long)&mesh_path_str.field_2 + 8));
LAB_004cb3af:
    ::std::vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>::
    ~vector((vector<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_> *)
            local_a8);
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::MaterialPath>_>_>
            *)&material_subsets.
               super__Vector_base<const_tinyusdz::GeomSubset_*,_std::allocator<const_tinyusdz::GeomSubset_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) goto LAB_004cb3db;
  }
  abs_path_local._7_1_ = 1;
LAB_004cb3db:
  return (bool)(abs_path_local._7_1_ & 1);
}

Assistant:

bool MeshVisitor(const tinyusdz::Path &abs_path, const tinyusdz::Prim &prim,
                 const int32_t level, void *userdata, std::string *err) {
  if (!userdata) {
    if (err) {
      (*err) += "userdata pointer must be filled.";
    }
    return false;
  }

  MeshVisitorEnv *visitorEnv = reinterpret_cast<MeshVisitorEnv *>(userdata);

  if (level > 1024 * 1024) {
    if (err) {
      (*err) += "Scene graph is too deep.\n";
    }
    // Too deep
    return false;
  }

  if (const tinyusdz::GeomMesh *pmesh = prim.as<tinyusdz::GeomMesh>()) {
    // Collect GeomSubsets
    // std::vector<const tinyusdz::GeomSubset *> subsets = GetGeomSubsets(;

    DCOUT("Mesh: " << abs_path);

    if (!pmesh->points.authored()) {
      // Maybe Collider mesh? Ignore for now.
      DCOUT(fmt::format("Mesh {} does not author `points` attribute(Maybe Collider mesh?). Ignore it for now", abs_path));
      return true;
    }

    //
    // First convert Material assigned to GeomMesh.
    //
    // - If prim has GeomSubset with materialBind, convert it to per-face
    // material.
    // - If prim has materialBind, convert it to RenderMesh's material.
    //

    auto ConvertBoundMaterial = [&](const Path &bound_material_path,
                                    const tinyusdz::Material *bound_material,
                                    int64_t &rmaterial_id) -> bool {
      std::vector<RenderMaterial> &rmaterials =
          visitorEnv->converter->materials;

      const auto matIt = visitorEnv->converter->materialMap.find(
          bound_material_path.full_path_name());

      if (matIt != visitorEnv->converter->materialMap.s_end()) {
        // Got material in the cache.
        uint64_t mat_id = matIt->second;
        if (mat_id >= visitorEnv->converter->materials
                          .size()) {  // this should not happen though
          if (err) {
            (*err) += "Material index out-of-range.\n";
          }
          return false;
        }

        if (mat_id >= size_t((std::numeric_limits<int32_t>::max)())) {
          if (err) {
            (*err) += "Material index too large.\n";
          }
          return false;
        }

        rmaterial_id = int64_t(mat_id);

      } else {
        RenderMaterial rmat;
        if (!visitorEnv->converter->ConvertMaterial(*visitorEnv->env,
                                                    bound_material_path,
                                                    *bound_material, &rmat)) {
          if (err) {
            (*err) += fmt::format("Material conversion failed: {}",
                                  bound_material_path);
          }
          return false;
        }

        // Assign new material ID
        uint64_t mat_id = rmaterials.size();

        if (mat_id >= uint64_t((std::numeric_limits<int32_t>::max)())) {
          if (err) {
            (*err) += "Material index too large.\n";
          }
          return false;
        }
        rmaterial_id = int64_t(mat_id);

        visitorEnv->converter->materialMap.add(
            bound_material_path.full_path_name(), uint64_t(rmaterial_id));
        DCOUT("Added renderMaterial: " << mat_id << " " << rmat.abs_path
                                       << " ( " << rmat.name << " ) ");

        rmaterials.push_back(rmat);
      }

      return true;
    };

    // Convert bound materials in GeomSubsets
    //
    // key: subset Prim name
    std::map<std::string, MaterialPath> subset_material_path_map;
    std::vector<const GeomSubset *> material_subsets;
    {
      material_subsets = GetMaterialBindGeomSubsets(prim);

      for (const auto &psubset : material_subsets) {
        MaterialPath mpath;
        mpath.default_texcoords_primvar_name =
            visitorEnv->env->mesh_config.default_texcoords_primvar_name;

        Path subset_abs_path = abs_path.AppendElement(psubset->name);

        // front and back
        {
          tinyusdz::Path bound_material_path;
          const tinyusdz::Material *bound_material{nullptr};
          bool ret = tinyusdz::tydra::GetBoundMaterial(
              visitorEnv->env->stage,
              /* GeomSubset prim path */ subset_abs_path,
              /* purpose */ "", &bound_material_path, &bound_material, err);

          if (ret && bound_material) {
            int64_t rmaterial_id = -1;  // not used.

            if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                      rmaterial_id)) {
              if (err) {
                (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
              }
              return false;
            }

            mpath.material_path = bound_material_path.full_path_name();
            DCOUT("GeomSubset " << subset_abs_path << " : Bound material path: "
                                << mpath.backface_material_path);
          }
        }

        std::string backface_purpose =
            visitorEnv->env->material_config
                .default_backface_material_purpose_name;

        if (!backface_purpose.empty() &&
            psubset->has_materialBinding(value::token(backface_purpose))) {
          DCOUT("backface_material_purpose "
                << visitorEnv->env->material_config
                       .default_backface_material_purpose_name);
          tinyusdz::Path bound_material_path;
          const tinyusdz::Material *bound_material{nullptr};
          bool ret = tinyusdz::tydra::GetBoundMaterial(
              visitorEnv->env->stage,
              /* GeomSubset prim path */ subset_abs_path,
              /* purpose */
              visitorEnv->env->material_config
                  .default_backface_material_purpose_name,
              &bound_material_path, &bound_material, err);

          if (ret && bound_material) {
            int64_t rmaterial_id = -1;  // not used

            if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                      rmaterial_id)) {
              if (err) {
                (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
              }
              return false;
            }

            mpath.backface_material_path = bound_material_path.full_path_name();
            DCOUT("GeomSubset " << subset_abs_path
                                << " : Bound backface material path: "
                                << mpath.backface_material_path);
          }
        }

        subset_material_path_map[psubset->name] = mpath;
      }
    }

    MaterialPath material_path;
    material_path.default_texcoords_primvar_name =
        visitorEnv->env->mesh_config.default_texcoords_primvar_name;
    // TODO: Implement feature to assign default material
    // id(MaterialPath::default_material_id) when no bound material found.

    {
      const std::string mesh_path_str = abs_path.full_path_name();

      // Front and back material.
      {
        tinyusdz::Path bound_material_path;
        const tinyusdz::Material *bound_material{nullptr};
        bool ret = tinyusdz::tydra::GetBoundMaterial(
            visitorEnv->env->stage, /* GeomMesh prim path */ abs_path,
            /* purpose */ "", &bound_material_path, &bound_material, err);

        if (ret && bound_material) {
          int64_t rmaterial_id = -1;  // not used

          if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                    rmaterial_id)) {
            if (err) {
              (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
            }
            return false;
          }

          material_path.material_path = bound_material_path.full_path_name();
          DCOUT("Bound material path: " << material_path.material_path);
        }
      }

      std::string backface_purpose =
          visitorEnv->env->material_config
              .default_backface_material_purpose_name;

      if (!backface_purpose.empty() &&
          pmesh->has_materialBinding(value::token(backface_purpose))) {
        tinyusdz::Path bound_material_path;
        const tinyusdz::Material *bound_material{nullptr};
        bool ret = tinyusdz::tydra::GetBoundMaterial(
            visitorEnv->env->stage, /* GeomMesh prim path */ abs_path,
            /* purpose */
            visitorEnv->env->material_config
                .default_backface_material_purpose_name,
            &bound_material_path, &bound_material, err);

        if (ret && bound_material) {
          int64_t rmaterial_id = -1;  // not used

          if (!ConvertBoundMaterial(bound_material_path, bound_material,
                                    rmaterial_id)) {
            if (err) {
              (*err) += "Convert boundMaterial failed: " + bound_material_path.full_path_name();
            }
            return false;
          }

          material_path.backface_material_path =
              bound_material_path.full_path_name();
          DCOUT("Bound backface material path: "
                << material_path.backface_material_path);
        }
      }

      // BlendShapes
      std::vector<std::pair<std::string, const BlendShape *>> blendshapes;
      {
        std::string local_err;
        blendshapes = GetBlendShapes(visitorEnv->env->stage, prim, &local_err);
        if (local_err.size()) {
          if (err) {
            (*err) += fmt::format("Failed to get BlendShapes prims. err = {}", local_err);
          }
        }
      }
      DCOUT("# of blendshapes : " << blendshapes.size());

      RenderMesh rmesh;

      if (!visitorEnv->converter->ConvertMesh(
              *visitorEnv->env, abs_path, *pmesh, material_path,
              subset_material_path_map, visitorEnv->converter->materialMap,
              material_subsets, blendshapes, &rmesh)) {
        if (err) {
          (*err) += fmt::format("Mesh conversion failed: {}",
                                abs_path.full_path_name());
          (*err) += "\n" + visitorEnv->converter->GetError() + "\n";

        }
        return false;
      }

      uint64_t mesh_id = uint64_t(visitorEnv->converter->meshes.size());
      if (mesh_id >= size_t((std::numeric_limits<int32_t>::max)())) {
        if (err) {
          (*err) += "Mesh index too large.\n";
        }
        return false;
      }
      visitorEnv->converter->meshMap.add(abs_path.full_path_name(), mesh_id);

      visitorEnv->converter->meshes.emplace_back(std::move(rmesh));
    }
  }

  return true;  // continue traversal
}